

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_ftw.cpp
# Opt level: O2

void __thiscall
edk2_ftw_t::edk2_ftw_t(edk2_ftw_t *this,kstream *p__io,kstruct *p__parent,edk2_ftw_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__edk2_ftw_t_00280d90;
  (this->m_signature)._M_dataplus._M_p = (pointer)&(this->m_signature).field_2;
  (this->m_signature)._M_string_length = 0;
  (this->m_signature).field_2._M_local_buf[0] = '\0';
  (this->m_reserved)._M_dataplus._M_p = (pointer)&(this->m_reserved).field_2;
  (this->m_reserved)._M_string_length = 0;
  (this->m_reserved).field_2._M_local_buf[0] = '\0';
  (this->m_write_queue_32)._M_dataplus._M_p = (pointer)&(this->m_write_queue_32).field_2;
  (this->m_write_queue_32)._M_string_length = 0;
  (this->m_write_queue_32).field_2._M_local_buf[0] = '\0';
  (this->m_write_queue_64)._M_dataplus._M_p = (pointer)&(this->m_write_queue_64).field_2;
  (this->m_write_queue_64)._M_string_length = 0;
  (this->m_write_queue_64).field_2._M_local_buf[0] = '\0';
  this->m__parent = p__parent;
  this->m__root = this;
  this->f_len_ftw_store_header_32 = false;
  this->f_len_ftw_store_header_64 = false;
  _read(this);
  return;
}

Assistant:

void edk2_ftw_t::_read() {
    m_signature = m__io->read_bytes(16);
    m_crc = m__io->read_u4le();
    m_state = m__io->read_u1();
    m_reserved = m__io->read_bytes(3);
    m_len_write_queue_32 = m__io->read_u4le();
    n_len_write_queue_64 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 0) {
        n_len_write_queue_64 = false;
        m_len_write_queue_64 = m__io->read_u4le();
    }
    n_write_queue_32 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 4) {
        n_write_queue_32 = false;
        m_write_queue_32 = m__io->read_bytes(len_write_queue_32());
    }
    n_write_queue_64 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 0) {
        n_write_queue_64 = false;
        m_write_queue_64 = m__io->read_bytes(((static_cast<uint64_t>(len_write_queue_64()) << 32) + len_write_queue_32()));
    }
}